

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O1

void FinishActor(FScriptPosition *sc,PClassActor *info,Baggage *bag)

{
  FStateDefinitions *this;
  AActor *defaults;
  DDropItem *pointed;
  FState *pFVar1;
  FState *pFVar2;
  FState *pFVar3;
  FState *pFVar4;
  PClassActor *pPVar5;
  FName local_40;
  FName local_3c;
  FName local_38;
  FName local_34;
  
  defaults = (AActor *)(info->super_PClass).Defaults;
  this = &bag->statedef;
  FStateDefinitions::FinishStates(this,info,defaults);
  FStateDefinitions::InstallStates(this,info,defaults);
  FStateDefinitions::MakeStateDefines(this,(PClassActor *)0x0);
  if (bag->DropItemSet == true) {
    pointed = bag->DropItemList;
    info->DropItems = pointed;
    if (((pointed != (DDropItem *)0x0) && (((pointed->super_DObject).ObjectFlags & 3) != 0)) &&
       (((info->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
         super_DObject.ObjectFlags & 4) != 0)) {
      GC::Barrier((DObject *)info,&pointed->super_DObject);
    }
  }
  pPVar5 = info;
  if ((PClassActor *)AInventory::RegistrationInfo.MyClass != info) {
    do {
      pPVar5 = (PClassActor *)(pPVar5->super_PClass).ParentClass;
      if (pPVar5 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
    } while (pPVar5 != (PClassActor *)0x0);
    if (pPVar5 == (PClassActor *)0x0) goto LAB_0063d7f7;
  }
  *(byte *)&(defaults->flags).Value = (byte)(defaults->flags).Value | 1;
LAB_0063d7f7:
  pPVar5 = info;
  if ((PClassActor *)AWeapon::RegistrationInfo.MyClass != info) {
    do {
      pPVar5 = (PClassActor *)(pPVar5->super_PClass).ParentClass;
      if (pPVar5 == (PClassActor *)AWeapon::RegistrationInfo.MyClass) break;
    } while (pPVar5 != (PClassActor *)0x0);
    if (pPVar5 == (PClassActor *)0x0) {
      return;
    }
  }
  local_34.Index = 0x9e;
  pFVar1 = PClassActor::FindState(info,1,&local_34,false);
  local_38.Index = 0x9b;
  pFVar2 = PClassActor::FindState(info,1,&local_38,false);
  local_3c.Index = 0x9c;
  pFVar3 = PClassActor::FindState(info,1,&local_3c,false);
  local_40.Index = 0x9f;
  pFVar4 = PClassActor::FindState(info,1,&local_40,false);
  if (((pFVar1 != (FState *)0x0 || pFVar2 != (FState *)0x0) || pFVar3 != (FState *)0x0) ||
      pFVar4 != (FState *)0x0) {
    if (pFVar1 == (FState *)0x0) {
      FScriptPosition::Message
                (sc,2,"Weapon %s doesn\'t define a ready state.\n",
                 FName::NameData.NameArray
                 [(info->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
    }
    if (pFVar2 == (FState *)0x0) {
      FScriptPosition::Message
                (sc,2,"Weapon %s doesn\'t define a select state.\n",
                 FName::NameData.NameArray
                 [(info->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
    }
    if (pFVar3 == (FState *)0x0) {
      FScriptPosition::Message
                (sc,2,"Weapon %s doesn\'t define a deselect state.\n",
                 FName::NameData.NameArray
                 [(info->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
    }
    if (pFVar4 == (FState *)0x0) {
      FScriptPosition::Message
                (sc,2,"Weapon %s doesn\'t define a fire state.\n",
                 FName::NameData.NameArray
                 [(info->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
    }
  }
  return;
}

Assistant:

void FinishActor(const FScriptPosition &sc, PClassActor *info, Baggage &bag)
{
	AActor *defaults = (AActor*)info->Defaults;

	try
	{
		bag.statedef.FinishStates (info, defaults);
	}
	catch (CRecoverableError &err)
	{
		sc.Message(MSG_ERROR, "%s", err.GetMessage());
		bag.statedef.MakeStateDefines(NULL);
		return;
	}
	bag.statedef.InstallStates (info, defaults);
	bag.statedef.MakeStateDefines(NULL);
	if (bag.DropItemSet)
	{
		info->DropItems = bag.DropItemList;
		GC::WriteBarrier(info, info->DropItems);
	}
	if (info->IsDescendantOf (RUNTIME_CLASS(AInventory)))
	{
		defaults->flags |= MF_SPECIAL;
	}

	// Weapons must be checked for all relevant states. They may crash the game otherwise.
	if (info->IsDescendantOf(RUNTIME_CLASS(AWeapon)))
	{
		FState *ready = info->FindState(NAME_Ready);
		FState *select = info->FindState(NAME_Select);
		FState *deselect = info->FindState(NAME_Deselect);
		FState *fire = info->FindState(NAME_Fire);

		// Consider any weapon without any valid state abstract and don't output a warning
		// This is for creating base classes for weapon groups that only set up some properties.
		if (ready || select || deselect || fire)
		{
			if (!ready)
			{
				sc.Message(MSG_ERROR, "Weapon %s doesn't define a ready state.\n", info->TypeName.GetChars());
			}
			if (!select) 
			{
				sc.Message(MSG_ERROR, "Weapon %s doesn't define a select state.\n", info->TypeName.GetChars());
			}
			if (!deselect) 
			{
				sc.Message(MSG_ERROR, "Weapon %s doesn't define a deselect state.\n", info->TypeName.GetChars());
			}
			if (!fire) 
			{
				sc.Message(MSG_ERROR, "Weapon %s doesn't define a fire state.\n", info->TypeName.GetChars());
			}
		}
	}
}